

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_example_mtr(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  value_type peVar1;
  size_type sVar2;
  v_array<COST_SENSITIVE::wclass> *pvVar3;
  reference ppeVar4;
  size_t sVar5;
  cb_class *pcVar6;
  wclass *new_ele;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long in_RDI;
  bool keep_example;
  wclass wc;
  label ld;
  size_t i;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffa0;
  v_array<COST_SENSITIVE::wclass> *this;
  undefined7 in_stack_ffffffffffffffa8;
  byte bVar7;
  float in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  v_array<CB::cb_class> local_40;
  v_array<COST_SENSITIVE::wclass> *local_20;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar2 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  *(size_type *)(local_8 + 8) = sVar2 + *(long *)(local_8 + 8);
  *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) + 1;
  std::vector<example_*,_std::allocator<example_*>_>::clear
            ((vector<example_*,_std::allocator<example_*>_> *)0x3ecaac);
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffa0);
  local_20 = (v_array<COST_SENSITIVE::wclass> *)0x0;
  while (this = local_20,
        pvVar3 = (v_array<COST_SENSITIVE::wclass> *)
                 std::vector<example_*,_std::allocator<example_*>_>::size(local_10), this < pvVar3)
  {
    ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_10,(size_type)local_20);
    peVar1 = *ppeVar4;
    local_40._begin = *(cb_class **)&(peVar1->l).multi;
    local_40._end = (cb_class *)(peVar1->l).cs.costs._end;
    local_40.end_array = (cb_class *)(peVar1->l).cs.costs.end_array;
    local_40.erase_count = (peVar1->l).cs.costs.erase_count;
    memset(&stack0xffffffffffffffb0,0,0x10);
    bVar7 = 0;
    sVar5 = v_array<CB::cb_class>::size(&local_40);
    if (sVar5 == 1) {
      pcVar6 = v_array<CB::cb_class>::operator[](&local_40,0);
      if ((pcVar6->cost != 3.4028235e+38) || (NAN(pcVar6->cost))) {
        pcVar6 = v_array<CB::cb_class>::operator[](&local_40,0);
        in_stack_ffffffffffffffb0 = pcVar6->cost;
        *(int *)(local_8 + 0x18) = (int)local_20;
        bVar7 = 1;
      }
    }
    if ((bVar7 & 1) != 0) {
      new_ele = (wclass *)(local_8 + 0x20);
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,(size_type)local_20);
      std::vector<example_*,_std::allocator<example_*>_>::push_back
                ((vector<example_*,_std::allocator<example_*>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (value_type *)CONCAT17(bVar7,in_stack_ffffffffffffffa8));
      v_array<COST_SENSITIVE::wclass>::push_back(this,new_ele);
    }
    local_20 = (v_array<COST_SENSITIVE::wclass> *)((long)&local_20->_begin + 1);
  }
  return;
}

Assistant:

void gen_cs_example_mtr(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  c.action_sum += ec_seq.size();
  c.event_sum++;

  c.mtr_ec_seq.clear();
  cs_labels.costs.clear();
  for (size_t i = 0; i < ec_seq.size(); i++)
  {
    CB::label ld = ec_seq[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0, 0, 0, 0};

    bool keep_example = false;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      wc.x = ld.costs[0].cost;
      c.mtr_example = (uint32_t)i;
      keep_example = true;
    }
    if (keep_example)
    {
      c.mtr_ec_seq.push_back(ec_seq[i]);
      cs_labels.costs.push_back(wc);
    }
  }
}